

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

void hsmooth64(LONGLONG *a,int nxtop,int nytop,int ny,int scale)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  LONGLONG m2;
  LONGLONG m1;
  LONGLONG smax;
  LONGLONG s;
  LONGLONG dmin;
  LONGLONG dmax;
  LONGLONG diff;
  LONGLONG hy2;
  LONGLONG hx2;
  LONGLONG hpp;
  LONGLONG hmp;
  LONGLONG hpm;
  LONGLONG hmm;
  LONGLONG hp;
  LONGLONG h0;
  LONGLONG hm;
  int s00;
  int s10;
  int ny2;
  int j;
  int i;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  int local_2c;
  int local_28;
  int local_20;
  int local_1c;
  
  lVar5 = (long)(in_R8D >> 1);
  if (0 < lVar5) {
    iVar4 = in_ECX * 2;
    for (local_1c = 2; local_1c < in_ESI + -2; local_1c = local_1c + 2) {
      local_2c = in_ECX * local_1c;
      local_28 = local_2c + in_ECX;
      for (local_20 = 0; local_20 < in_EDX; local_20 = local_20 + 2) {
        lVar1 = *(long *)(in_RDI + (long)(local_2c + in_ECX * -2) * 8);
        lVar2 = *(long *)(in_RDI + (long)local_2c * 8);
        local_d8 = *(long *)(in_RDI + (long)(local_2c + iVar4) * 8);
        lVar6 = local_d8 - lVar1;
        if (local_d8 - lVar2 < lVar2 - lVar1) {
          local_b8 = local_d8 - lVar2;
        }
        else {
          local_b8 = lVar2 - lVar1;
        }
        if (local_b8 < 1) {
          local_c8 = 0;
        }
        else {
          if (local_d8 - lVar2 < lVar2 - lVar1) {
            local_c0 = local_d8 - lVar2;
          }
          else {
            local_c0 = lVar2 - lVar1;
          }
          local_c8 = local_c0;
        }
        local_f0 = local_c8 << 2;
        if (lVar2 - lVar1 < local_d8 - lVar2) {
          local_d0 = local_d8 - lVar2;
        }
        else {
          local_d0 = lVar2 - lVar1;
        }
        if (local_d0 < 0) {
          if (lVar2 - lVar1 < local_d8 - lVar2) {
            local_d8 = local_d8 - lVar2;
          }
          else {
            local_d8 = lVar2 - lVar1;
          }
          local_e0 = local_d8;
        }
        else {
          local_e0 = 0;
        }
        local_f8 = local_e0 << 2;
        if (local_f8 < local_f0) {
          local_e8 = local_f0;
          if (lVar6 < local_f0) {
            local_e8 = lVar6;
          }
          if (local_f8 < local_e8) {
            if (lVar6 < local_f0) {
              local_f0 = lVar6;
            }
            local_f8 = local_f0;
          }
          local_f8 = local_f8 + *(long *)(in_RDI + (long)local_28 * 8) * -8;
          if (local_f8 < 0) {
            local_f8 = local_f8 + 7;
          }
          local_100 = local_f8 >> 3;
          local_108 = lVar5;
          if (local_100 < lVar5) {
            local_108 = local_100;
          }
          if (-lVar5 < local_108) {
            local_110 = lVar5;
            if (local_100 < lVar5) {
              local_110 = local_100;
            }
            local_118 = local_110;
          }
          else {
            local_118 = -lVar5;
          }
          *(long *)(in_RDI + (long)local_28 * 8) =
               *(long *)(in_RDI + (long)local_28 * 8) + local_118;
        }
        local_2c = local_2c + 2;
        local_28 = local_28 + 2;
      }
    }
    for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 2) {
      iVar3 = in_ECX * local_1c;
      for (local_20 = 2; local_2c = iVar3 + 2, local_20 < in_EDX + -2; local_20 = local_20 + 2) {
        lVar1 = *(long *)(in_RDI + (long)iVar3 * 8);
        lVar2 = *(long *)(in_RDI + (long)local_2c * 8);
        local_140 = *(long *)(in_RDI + (long)(iVar3 + 4) * 8);
        lVar6 = local_140 - lVar1;
        if (local_140 - lVar2 < lVar2 - lVar1) {
          local_120 = local_140 - lVar2;
        }
        else {
          local_120 = lVar2 - lVar1;
        }
        if (local_120 < 1) {
          local_130 = 0;
        }
        else {
          if (local_140 - lVar2 < lVar2 - lVar1) {
            local_128 = local_140 - lVar2;
          }
          else {
            local_128 = lVar2 - lVar1;
          }
          local_130 = local_128;
        }
        local_158 = local_130 << 2;
        if (lVar2 - lVar1 < local_140 - lVar2) {
          local_138 = local_140 - lVar2;
        }
        else {
          local_138 = lVar2 - lVar1;
        }
        if (local_138 < 0) {
          if (lVar2 - lVar1 < local_140 - lVar2) {
            local_140 = local_140 - lVar2;
          }
          else {
            local_140 = lVar2 - lVar1;
          }
          local_148 = local_140;
        }
        else {
          local_148 = 0;
        }
        local_160 = local_148 << 2;
        if (local_160 < local_158) {
          local_150 = local_158;
          if (lVar6 < local_158) {
            local_150 = lVar6;
          }
          if (local_160 < local_150) {
            if (lVar6 < local_158) {
              local_158 = lVar6;
            }
            local_160 = local_158;
          }
          local_160 = local_160 + *(long *)(in_RDI + (long)(iVar3 + 3) * 8) * -8;
          if (local_160 < 0) {
            local_160 = local_160 + 7;
          }
          local_168 = local_160 >> 3;
          local_170 = lVar5;
          if (local_168 < lVar5) {
            local_170 = local_168;
          }
          if (-lVar5 < local_170) {
            local_178 = lVar5;
            if (local_168 < lVar5) {
              local_178 = local_168;
            }
            local_180 = local_178;
          }
          else {
            local_180 = -lVar5;
          }
          *(long *)(in_RDI + (long)(iVar3 + 3) * 8) =
               *(long *)(in_RDI + (long)(iVar3 + 3) * 8) + local_180;
        }
        iVar3 = local_2c;
      }
    }
    for (local_1c = 2; local_1c < in_ESI + -2; local_1c = local_1c + 2) {
      local_2c = in_ECX * local_1c + 2;
      local_28 = local_2c + in_ECX;
      for (local_20 = 2; local_20 < in_EDX + -2; local_20 = local_20 + 2) {
        local_248 = *(long *)(in_RDI + (long)(local_2c + in_ECX * -2 + -2) * 8);
        local_218 = *(long *)(in_RDI + (long)(local_2c + iVar4 + -2) * 8);
        lVar1 = *(long *)(in_RDI + (long)(local_2c + in_ECX * -2 + 2) * 8);
        local_208 = *(long *)(in_RDI + (long)(local_2c + iVar4 + 2) * 8);
        local_238 = *(long *)(in_RDI + (long)local_2c * 8);
        lVar7 = ((local_208 + local_248) - lVar1) - local_218;
        lVar2 = *(long *)(in_RDI + (long)local_28 * 8);
        lVar8 = lVar2 * 2;
        lVar6 = *(long *)(in_RDI + (long)(local_2c + 1) * 8);
        local_240 = lVar6 * 2;
        if (local_208 - local_238 < 1) {
          local_188 = 0;
        }
        else {
          local_188 = local_208 - local_238;
        }
        if (local_238 - local_218 < 1) {
          local_198 = 0;
        }
        else {
          local_198 = local_238 - local_218;
        }
        if (local_188 + lVar2 * -2 + lVar6 * -2 < local_198 + lVar8 + lVar6 * -2) {
          if (local_208 - local_238 < 1) {
            local_1a0 = 0;
          }
          else {
            local_1a0 = local_208 - local_238;
          }
          local_1a8 = local_1a0 + lVar2 * -2 + lVar6 * -2;
        }
        else {
          if (local_238 - local_218 < 1) {
            local_1b0 = 0;
          }
          else {
            local_1b0 = local_238 - local_218;
          }
          local_1a8 = local_1b0 + lVar8 + lVar6 * -2;
        }
        if (local_238 - lVar1 < 1) {
          local_1b8 = 0;
        }
        else {
          local_1b8 = local_238 - lVar1;
        }
        if (local_248 - local_238 < 1) {
          local_1c8 = 0;
        }
        else {
          local_1c8 = local_248 - local_238;
        }
        if (local_1b8 + lVar2 * -2 + local_240 < local_1c8 + lVar8 + local_240) {
          if (local_238 - lVar1 < 1) {
            local_1d0 = 0;
          }
          else {
            local_1d0 = local_238 - lVar1;
          }
          local_1d0 = local_1d0 + lVar2 * -2;
        }
        else {
          if (local_248 - local_238 < 1) {
            local_1e0 = 0;
          }
          else {
            local_1e0 = local_248 - local_238;
          }
          local_1d0 = local_1e0 + lVar8;
        }
        local_1d8 = local_1d0 + local_240;
        if (local_1a8 < local_1d8) {
          local_1e8 = local_1a8;
        }
        else {
          local_1e8 = local_1d8;
        }
        local_260 = local_1e8 << 4;
        if (local_208 - local_238 < 0) {
          local_1f0 = local_208 - local_238;
        }
        else {
          local_1f0 = 0;
        }
        if (local_238 - local_218 < 0) {
          local_200 = local_238 - local_218;
        }
        else {
          local_200 = 0;
        }
        if (local_200 + lVar8 + lVar6 * -2 < local_1f0 + lVar2 * -2 + lVar6 * -2) {
          if (local_208 - local_238 < 0) {
            local_208 = local_208 - local_238;
          }
          else {
            local_208 = 0;
          }
          local_210 = local_208 + lVar2 * -2 + lVar6 * -2;
        }
        else {
          if (local_238 - local_218 < 0) {
            local_218 = local_238 - local_218;
          }
          else {
            local_218 = 0;
          }
          local_210 = local_218 + lVar8 + lVar6 * -2;
        }
        if (local_238 - lVar1 < 0) {
          local_220 = local_238 - lVar1;
        }
        else {
          local_220 = 0;
        }
        if (local_248 - local_238 < 0) {
          local_230 = local_248 - local_238;
        }
        else {
          local_230 = 0;
        }
        if (local_230 + lVar8 + local_240 < local_220 + lVar2 * -2 + local_240) {
          if (local_238 - lVar1 < 0) {
            local_238 = local_238 - lVar1;
          }
          else {
            local_238 = 0;
          }
          local_238 = local_238 + lVar2 * -2;
        }
        else {
          if (local_248 - local_238 < 0) {
            local_248 = local_248 - local_238;
          }
          else {
            local_248 = 0;
          }
          local_238 = local_248 + lVar8;
        }
        local_240 = local_238 + local_240;
        if (local_240 < local_210) {
          local_250 = local_210;
        }
        else {
          local_250 = local_240;
        }
        local_268 = local_250 << 4;
        if (local_268 < local_260) {
          local_258 = local_260;
          if (lVar7 < local_260) {
            local_258 = lVar7;
          }
          if (local_268 < local_258) {
            if (lVar7 < local_260) {
              local_260 = lVar7;
            }
            local_268 = local_260;
          }
          local_268 = local_268 + *(long *)(in_RDI + (long)(local_28 + 1) * 8) * -0x40;
          if (local_268 < 0) {
            local_268 = local_268 + 0x3f;
          }
          local_270 = local_268 >> 6;
          local_278 = lVar5;
          if (local_270 < lVar5) {
            local_278 = local_270;
          }
          if (-lVar5 < local_278) {
            local_280 = lVar5;
            if (local_270 < lVar5) {
              local_280 = local_270;
            }
            local_288 = local_280;
          }
          else {
            local_288 = -lVar5;
          }
          *(long *)(in_RDI + (long)(local_28 + 1) * 8) =
               *(long *)(in_RDI + (long)(local_28 + 1) * 8) + local_288;
        }
        local_2c = local_2c + 2;
        local_28 = local_28 + 2;
      }
    }
  }
  return;
}

Assistant:

static void 
hsmooth64(LONGLONG a[], int nxtop, int nytop, int ny, int scale)
/*
LONGLONG a[];			 array of H-transform coefficients		
int nxtop,nytop;	 size of coefficient block to use			
int ny;				 actual 1st dimension of array			
int scale;			 truncation scale factor that was used	
*/
{
int i, j;
int ny2, s10, s00;
LONGLONG hm, h0, hp, hmm, hpm, hmp, hpp, hx2, hy2, diff, dmax, dmin, s, smax, m1, m2;

	/*
	 * Maximum change in coefficients is determined by scale factor.
	 * Since we rounded during division (see digitize.c), the biggest
	 * permitted change is scale/2.
	 */
	smax = (scale >> 1);
	if (smax <= 0) return;
	ny2 = ny << 1;
	/*
	 * We're indexing a as a 2-D array with dimensions (nxtop,ny) of which
	 * only (nxtop,nytop) are used.  The coefficients on the edge of the
	 * array are not adjusted (which is why the loops below start at 2
	 * instead of 0 and end at nxtop-2 instead of nxtop.)
	 */
	/*
	 * Adjust x difference hx
	 */
	for (i = 2; i<nxtop-2; i += 2) {
		s00 = ny*i;				/* s00 is index of a[i,j]	*/
		s10 = s00+ny;			/* s10 is index of a[i+1,j]	*/
		for (j = 0; j<nytop; j += 2) {
			/*
			 * hp is h0 (mean value) in next x zone, hm is h0 in previous x zone
			 */
			hm = a[s00-ny2];
			h0 = a[s00];
			hp = a[s00+ny2];
			/*
			 * diff = 8 * hx slope that would match h0 in neighboring zones
			 */
			diff = hp-hm;
			/*
			 * monotonicity constraints on diff
			 */
			dmax = max( min( (hp-h0), (h0-hm) ), 0 ) << 2;
			dmin = min( max( (hp-h0), (h0-hm) ), 0 ) << 2;
			/*
			 * if monotonicity would set slope = 0 then don't change hx.
			 * note dmax>=0, dmin<=0.
			 */
			if (dmin < dmax) {
				diff = max( min(diff, dmax), dmin);
				/*
				 * Compute change in slope limited to range +/- smax.
				 * Careful with rounding negative numbers when using
				 * shift for divide by 8.
				 */
				s = diff-(a[s10]<<3);
				s = (s>=0) ? (s>>3) : ((s+7)>>3) ;
				s = max( min(s, smax), -smax);
				a[s10] = a[s10]+s;
			}
			s00 += 2;
			s10 += 2;
		}
	}
	/*
	 * Adjust y difference hy
	 */
	for (i = 0; i<nxtop; i += 2) {
		s00 = ny*i+2;
		s10 = s00+ny;
		for (j = 2; j<nytop-2; j += 2) {
			hm = a[s00-2];
			h0 = a[s00];
			hp = a[s00+2];
			diff = hp-hm;
			dmax = max( min( (hp-h0), (h0-hm) ), 0 ) << 2;
			dmin = min( max( (hp-h0), (h0-hm) ), 0 ) << 2;
			if (dmin < dmax) {
				diff = max( min(diff, dmax), dmin);
				s = diff-(a[s00+1]<<3);
				s = (s>=0) ? (s>>3) : ((s+7)>>3) ;
				s = max( min(s, smax), -smax);
				a[s00+1] = a[s00+1]+s;
			}
			s00 += 2;
			s10 += 2;
		}
	}
	/*
	 * Adjust curvature difference hc
	 */
	for (i = 2; i<nxtop-2; i += 2) {
		s00 = ny*i+2;
		s10 = s00+ny;
		for (j = 2; j<nytop-2; j += 2) {
			/*
			 * ------------------    y
			 * | hmp |    | hpp |    |
			 * ------------------    |
			 * |     | h0 |     |    |
			 * ------------------    -------x
			 * | hmm |    | hpm |
			 * ------------------
			 */
			hmm = a[s00-ny2-2];
			hpm = a[s00+ny2-2];
			hmp = a[s00-ny2+2];
			hpp = a[s00+ny2+2];
			h0  = a[s00];
			/*
			 * diff = 64 * hc value that would match h0 in neighboring zones
			 */
			diff = hpp + hmm - hmp - hpm;
			/*
			 * 2 times x,y slopes in this zone
			 */
			hx2 = a[s10  ]<<1;
			hy2 = a[s00+1]<<1;
			/*
			 * monotonicity constraints on diff
			 */
			m1 = min(max(hpp-h0,0)-hx2-hy2, max(h0-hpm,0)+hx2-hy2);
			m2 = min(max(h0-hmp,0)-hx2+hy2, max(hmm-h0,0)+hx2+hy2);
			dmax = min(m1,m2) << 4;
			m1 = max(min(hpp-h0,0)-hx2-hy2, min(h0-hpm,0)+hx2-hy2);
			m2 = max(min(h0-hmp,0)-hx2+hy2, min(hmm-h0,0)+hx2+hy2);
			dmin = max(m1,m2) << 4;
			/*
			 * if monotonicity would set slope = 0 then don't change hc.
			 * note dmax>=0, dmin<=0.
			 */
			if (dmin < dmax) {
				diff = max( min(diff, dmax), dmin);
				/*
				 * Compute change in slope limited to range +/- smax.
				 * Careful with rounding negative numbers when using
				 * shift for divide by 64.
				 */
				s = diff-(a[s10+1]<<6);
				s = (s>=0) ? (s>>6) : ((s+63)>>6) ;
				s = max( min(s, smax), -smax);
				a[s10+1] = a[s10+1]+s;
			}
			s00 += 2;
			s10 += 2;
		}
	}
}